

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O3

void __thiscall QList<QPoint>::resize(QList<QPoint> *this,qsizetype size)

{
  Data *pDVar1;
  qsizetype qVar2;
  
  pDVar1 = (this->d).d;
  if (((pDVar1 == (Data *)0x0) ||
      (1 < (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) ||
     ((pDVar1->super_QArrayData).alloc -
      ((long)((long)(this->d).ptr -
             ((ulong)((long)&pDVar1[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0)) >> 3) <
      size)) {
    QArrayDataPointer<QPoint>::detachAndGrow
              (&this->d,GrowsAtEnd,size - (this->d).size,(QPoint **)0x0,
               (QArrayDataPointer<QPoint> *)0x0);
    qVar2 = (this->d).size;
  }
  else {
    qVar2 = (this->d).size;
    if (size < qVar2) goto LAB_004171db;
  }
  if (size - qVar2 == 0 || size < qVar2) {
    return;
  }
  memset((this->d).ptr + qVar2,0,(size - qVar2) * 8);
LAB_004171db:
  (this->d).size = size;
  return;
}

Assistant:

void resize(qsizetype size)
    {
        resize_internal(size);
        if (size > this->size())
            d->appendInitialize(size);
    }